

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmCore.c
# Opt level: O1

Gia_Man_t * Mpm_ManPerformLutMapping(Mig_Man_t *pMig,Mpm_Par_t *pPars)

{
  Mpm_Man_t *p;
  Gia_Man_t *pGVar1;
  
  p = Mpm_ManStart(pMig,pPars);
  if (p->pPars->fVerbose != 0) {
    Mpm_ManPrintStatsInit(p);
  }
  Mpm_ManPrepare(p);
  Mpm_ManPerform(p);
  if (p->pPars->fVerbose != 0) {
    Mpm_ManPrintStats(p);
  }
  pGVar1 = (Gia_Man_t *)Mpm_ManFromIfLogic(p);
  Mpm_ManStop(p);
  return pGVar1;
}

Assistant:

Gia_Man_t * Mpm_ManPerformLutMapping( Mig_Man_t * pMig, Mpm_Par_t * pPars )
{
    Gia_Man_t * pNew;
    Mpm_Man_t * p;
    p = Mpm_ManStart( pMig, pPars );
    if ( p->pPars->fVerbose ) 
        Mpm_ManPrintStatsInit( p );
    Mpm_ManPrepare( p );
    Mpm_ManPerform( p );
    if ( p->pPars->fVerbose ) 
        Mpm_ManPrintStats( p );
    pNew = (Gia_Man_t *)Mpm_ManFromIfLogic( p );
    Mpm_ManStop( p );
    return pNew;
}